

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall
cppforth::Forth::ForthStack<unsigned_int>::push(ForthStack<unsigned_int> *this,uint x)

{
  reference pvVar1;
  AbortException *this_00;
  uint uVar2;
  
  uVar2 = this->top + 1;
  if ((ulong)uVar2 <
      (ulong)((long)(this->stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2)) {
    this->top = uVar2;
    pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(&this->stack,(ulong)uVar2)
    ;
    *pvVar1 = x;
    return;
  }
  this_00 = (AbortException *)__cxa_allocate_exception(0x10);
  AbortException::AbortException(this_00,"Forth stack overflow");
  __cxa_throw(this_00,&AbortException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void push(CellType x) {
				{auto index1 = top + 1;
				if ((index1) < 0 || (index1) >= stack.size()){
					throw AbortException("Forth stack overflow");
				}
				}
				stack.at(++top) = x;
			}